

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_tests.cpp
# Opt level: O0

void immutable::test_push_tail(void)

{
  char *pcVar1;
  ref<immutable::rrb<char,_true,_5>_> local_38;
  ref<immutable::rrb<char,_true,_5>_> pushed_tree_c;
  ref<immutable::rrb<char,_true,_5>_> pushed_tree_b;
  ref<immutable::rrb<char,_true,_5>_> local_18;
  ref<immutable::rrb<char,_true,_5>_> pushed_tree_a;
  ref<immutable::rrb<char,_true,_5>_> tree;
  
  rrb_create<char,true,5>();
  rrb_push<char,true,5>((immutable *)&local_18,&pushed_tree_a,'a');
  rrb_push<char,true,5>((immutable *)&pushed_tree_c,&local_18,'b');
  rrb_push<char,true,5>((immutable *)&local_38,&pushed_tree_c,'c');
  pcVar1 = rrb_nth<char,true,5>(&local_18,0);
  TestEq<char,char>('a',*pcVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x36,"void immutable::test_push_tail()");
  pcVar1 = rrb_nth<char,true,5>(&pushed_tree_c,0);
  TestEq<char,char>('a',*pcVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x37,"void immutable::test_push_tail()");
  pcVar1 = rrb_nth<char,true,5>(&local_38,0);
  TestEq<char,char>('a',*pcVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x38,"void immutable::test_push_tail()");
  pcVar1 = rrb_nth<char,true,5>(&pushed_tree_c,1);
  TestEq<char,char>('b',*pcVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x39,"void immutable::test_push_tail()");
  pcVar1 = rrb_nth<char,true,5>(&local_38,1);
  TestEq<char,char>('b',*pcVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x3a,"void immutable::test_push_tail()");
  pcVar1 = rrb_nth<char,true,5>(&local_38,2);
  TestEq<char,char>('c',*pcVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/rrb_tests.cpp"
                    ,0x3b,"void immutable::test_push_tail()");
  ref<immutable::rrb<char,_true,_5>_>::~ref(&local_38);
  ref<immutable::rrb<char,_true,_5>_>::~ref(&pushed_tree_c);
  ref<immutable::rrb<char,_true,_5>_>::~ref(&local_18);
  ref<immutable::rrb<char,_true,_5>_>::~ref(&pushed_tree_a);
  return;
}

Assistant:

void test_push_tail()
    {
    ref<rrb<char>> tree = rrb_create<char, true, 5>();

    ref<rrb<char>> pushed_tree_a = rrb_push(tree, 'a');
    ref<rrb<char>> pushed_tree_b = rrb_push(pushed_tree_a, 'b');
    ref<rrb<char>> pushed_tree_c = rrb_push(pushed_tree_b, 'c');

    TEST_EQ('a', rrb_nth(pushed_tree_a, 0));
    TEST_EQ('a', rrb_nth(pushed_tree_b, 0));
    TEST_EQ('a', rrb_nth(pushed_tree_c, 0));
    TEST_EQ('b', rrb_nth(pushed_tree_b, 1));
    TEST_EQ('b', rrb_nth(pushed_tree_c, 1));
    TEST_EQ('c', rrb_nth(pushed_tree_c, 2));
    }